

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,StringTree *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,String *params_9,ArrayPtr<const_char> *params_10,
          ArrayPtr<const_char> *params_11,ArrayPtr<const_char> *params_12,StringTree *params_13,
          ArrayPtr<const_char> *params_14)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  size_t sVar5;
  char *pos;
  long lVar6;
  size_t result_2;
  size_t local_e0;
  char *local_d8;
  size_t sStack_d0;
  size_t local_c8;
  size_t sStack_c0;
  size_t local_b8;
  char *local_b0;
  char *local_a8;
  size_t sStack_a0;
  size_t local_98;
  size_t local_90;
  size_t sStack_88;
  size_t local_80;
  char *local_78;
  char *local_70;
  String local_68;
  StringTree *local_50;
  ArrayPtr<const_char> *local_48;
  ArrayPtr<const_char> *local_40;
  ArrayPtr<const_char> *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_e0 = this->size_;
  local_d8 = (params->text).content.ptr;
  sStack_d0 = params_1->size_;
  local_c8 = params_2->size_;
  sStack_c0 = params_3->size_;
  local_b8 = params_4->size_;
  local_b0 = params_5->ptr;
  local_a8 = (params_6->text).content.ptr;
  sStack_a0 = params_7->size_;
  sVar5 = 0;
  local_98 = params_8->size_ - 1;
  if (params_8->size_ == 0) {
    local_98 = sVar5;
  }
  local_90 = (params_9->content).size_;
  sStack_88 = params_10->size_;
  local_80 = params_11->size_;
  local_78 = params_12->ptr;
  local_70 = (params_13->text).content.ptr;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_e0 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x78);
  __return_storage_ptr__->size_ = sVar5;
  sVar5 = 0;
  local_e0 = 0;
  local_b0 = (char *)0x0;
  local_98 = 0;
  local_78 = (char *)0x0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_e0 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x78);
  local_50 = params;
  local_48 = params_1;
  local_40 = params_3;
  local_38 = params_2;
  heapString(&local_68,sVar5);
  (__return_storage_ptr__->text).content.ptr = local_68.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_68.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_68.content.disposer;
  local_e0 = 1;
  local_d8 = (char *)0x0;
  sStack_d0 = 0;
  local_c8 = 0;
  sStack_c0 = 0;
  sVar5 = 0;
  local_b8 = 0;
  local_b0 = (char *)0x1;
  local_a8 = (char *)0x0;
  sStack_a0 = 0;
  local_98 = 1;
  local_90 = 0;
  sStack_88 = 0;
  local_80 = 0;
  local_78 = (char *)0x1;
  local_70 = (char *)0x0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_e0 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x78);
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar5,sVar5,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                      ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_68.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_68.content.ptr = (char *)pBVar4;
  local_68.content.size_ = sVar5;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = sVar5;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,this,(ArrayPtr<const_char> *)local_50,local_48,local_38,
             local_40,params_4,(StringTree *)params_5,(ArrayPtr<const_char> *)params_6,params_7,
             (String *)params_8,(ArrayPtr<const_char> *)params_9,params_10,params_11,
             (StringTree *)params_12,(ArrayPtr<const_char> *)params_13);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}